

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase138::TestCase138(TestCase138 *this)

{
  TestCase138 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-test.c++"
             ,0x8a,"legacy test: Serialize/FlatArrayOddSegmentCount");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c23f0;
  return;
}

Assistant:

TEST(Serialize, FlatArrayOddSegmentCount) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  kj::Array<word> serialized = messageToFlatArray(builder);

  {
    FlatArrayMessageReader reader(serialized.asPtr());
    checkTestMessage(reader.getRoot<TestAllTypes>());
    EXPECT_EQ(serialized.end(), reader.getEnd());
  }

  kj::Array<word> serializedWithSuffix = kj::heapArray<word>(serialized.size() + 5);
  memcpy(serializedWithSuffix.begin(), serialized.begin(), serialized.size() * sizeof(word));

  {
    FlatArrayMessageReader reader(serializedWithSuffix.asPtr());
    checkTestMessage(reader.getRoot<TestAllTypes>());
    EXPECT_EQ(serializedWithSuffix.end() - 5, reader.getEnd());
  }

  {
    // Test expectedSizeInWordsFromPrefix(). We pass in a copy of the slice so that valgrind can
    // detect out-of-bounds access.

    // Segment table is 4 words, so with fewer words we'll have incomplete information.
    for (uint i = 0; i < 4; i++) {
      size_t expectedSize = expectedSizeInWordsFromPrefix(copyWords(serialized.slice(0, i)));
      EXPECT_LT(expectedSize, serialized.size());
      EXPECT_GT(expectedSize, i);
    }
    // After that, we get the exact length.
    for (uint i = 4; i <= serialized.size(); i++) {
      EXPECT_EQ(serialized.size(),
          expectedSizeInWordsFromPrefix(copyWords(serialized.slice(0, i))));
    }
  }
}